

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BP5Writer.cpp
# Opt level: O3

uint64_t __thiscall
adios2::core::engine::BP5Writer::CountStepsInMetadataIndex(BP5Writer *this,BufferSTL *bufferSTL)

{
  size_t *psVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  char cVar3;
  byte bVar4;
  uint uVar5;
  pointer puVar6;
  pointer puVar7;
  size_t sVar8;
  long lVar9;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  bool bVar12;
  uint uVar13;
  undefined8 *puVar15;
  long *plVar16;
  pointer pcVar17;
  long *plVar18;
  ulong *puVar19;
  ulong uVar20;
  size_type *psVar21;
  ulong uVar22;
  uint uVar23;
  char cVar24;
  char *pcVar25;
  undefined8 uVar26;
  ulong uVar27;
  size_t sVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  vector<unsigned_long,_std::allocator<unsigned_long>_> writerToFileMap;
  uint64_t subfileIdx;
  string __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_158;
  string local_138;
  string local_118;
  string local_f8;
  string local_d8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b8;
  ulong *local_98;
  long local_90;
  ulong local_88 [2];
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_78;
  long *local_70;
  long local_68;
  long local_60;
  long lStack_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  int iVar14;
  
  local_158._M_string_length = (size_type)local_158._M_dataplus._M_p;
  pcVar17 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  if ((ulong)((long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_finish - (long)pcVar17) < 0x40) {
    this->m_AppendMetadataPos = 0;
    this->m_AppendMetaMetadataPos = 0;
    this->m_AppendMetadataIndexPos = 0;
    auVar10._8_8_ = 0;
    auVar10._0_8_ = local_158._M_dataplus._M_p;
    local_158._0_16_ = auVar10 << 0x40;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
              (&this->m_AppendDataPos,this->m_Aggregator->m_NumAggregators,
               (value_type_conflict9 *)&local_158);
    return 0;
  }
  (bufferSTL->super_Buffer).m_Position = 0x24;
  cVar3 = pcVar17[0x24];
  (bufferSTL->super_Buffer).m_Position = 0x25;
  bVar12 = helper::IsLittleEndian();
  if ((cVar3 == '\0') != bVar12) {
    pcVar25 = "Big";
    if (cVar3 == '\0') {
      pcVar25 = "Little";
    }
    local_158._M_dataplus._M_p = (pointer)((long)&local_158 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,pcVar25,pcVar25 + (ulong)(cVar3 == '\0') * 3 + 3);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"BP5Writer","");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"CountStepsInMetadataIndex","");
    std::operator+(&local_b8,
                   "ADIOS2 BP5 Engine only supports appending with the same endianness. The existing file is "
                   ,&local_158);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    psVar21 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_138.field_2._M_allocated_capacity = *psVar21;
      local_138.field_2._8_8_ = puVar15[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar21;
      local_138._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_138._M_string_length = puVar15[1];
    *puVar15 = psVar21;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_f8,&local_d8,&local_118,&local_138,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
      operator_delete(local_158._M_dataplus._M_p);
    }
  }
  (bufferSTL->super_Buffer).m_Position = 0x25;
  pcVar17 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
  bVar4 = pcVar17[0x25];
  (bufferSTL->super_Buffer).m_Position = 0x26;
  if (bVar4 != 5) {
    local_158._M_dataplus._M_p = (pointer)((long)&local_158 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Engine","");
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"BP5Writer","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_d8,"CountStepsInMetadataIndex","");
    uVar31 = 1;
    if (9 < bVar4) {
      uVar31 = 3 - (bVar4 < 100);
    }
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct((ulong)&local_b8,(char)uVar31);
    std::__detail::__to_chars_10_impl<unsigned_int>(local_b8._M_dataplus._M_p,uVar31,(uint)bVar4);
    puVar15 = (undefined8 *)std::__cxx11::string::replace((ulong)&local_b8,0,(char *)0x0,0x7461d5);
    psVar21 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_138.field_2._M_allocated_capacity = *psVar21;
      local_138.field_2._8_8_ = puVar15[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar21;
      local_138._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_138._M_string_length = puVar15[1];
    *puVar15 = psVar21;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    plVar16 = (long *)std::__cxx11::string::append((char *)&local_138);
    psVar21 = (size_type *)(plVar16 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar16 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_118.field_2._M_allocated_capacity = *psVar21;
      local_118.field_2._8_8_ = plVar16[3];
      local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    }
    else {
      local_118.field_2._M_allocated_capacity = *psVar21;
      local_118._M_dataplus._M_p = (pointer)*plVar16;
    }
    local_118._M_string_length = plVar16[1];
    *plVar16 = (long)psVar21;
    plVar16[1] = 0;
    *(undefined1 *)(plVar16 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_158,&local_f8,&local_d8,&local_118,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    pcVar17 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  (bufferSTL->super_Buffer).m_Position = 0x26;
  bVar4 = pcVar17[0x26];
  (bufferSTL->super_Buffer).m_Position = 0x27;
  if (bVar4 == 2) goto LAB_0047cccd;
  local_158._M_dataplus._M_p = (pointer)((long)&local_158 + 0x10);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_158,"Engine","");
  local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"BP5Writer","");
  local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_d8,"CountStepsInMetadataIndex","");
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct((ulong)local_50,'\x01');
  *local_50[0] = 0x32;
  plVar16 = (long *)std::__cxx11::string::replace((ulong)local_50,0,(char *)0x0,0x746efc);
  local_70 = &local_60;
  plVar18 = plVar16 + 2;
  if ((long *)*plVar16 == plVar18) {
    local_60 = *plVar18;
    lStack_58 = plVar16[3];
  }
  else {
    local_60 = *plVar18;
    local_70 = (long *)*plVar16;
  }
  local_68 = plVar16[1];
  *plVar16 = (long)plVar18;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  plVar16 = (long *)std::__cxx11::string::append((char *)&local_70);
  paVar2 = &local_b8.field_2;
  puVar19 = (ulong *)(plVar16 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar16 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)puVar19) {
    local_b8.field_2._M_allocated_capacity = *puVar19;
    local_b8.field_2._8_8_ = plVar16[3];
    local_b8._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_b8.field_2._M_allocated_capacity = *puVar19;
    local_b8._M_dataplus._M_p = (pointer)*plVar16;
  }
  local_b8._M_string_length = plVar16[1];
  *plVar16 = (long)puVar19;
  plVar16[1] = 0;
  *(undefined1 *)(plVar16 + 2) = 0;
  uVar31 = 1;
  if (9 < bVar4) {
    uVar31 = 3 - (bVar4 < 100);
  }
  local_98 = local_88;
  std::__cxx11::string::_M_construct((ulong)&local_98,(char)uVar31);
  std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_98,uVar31,(uint)bVar4);
  uVar26 = 0xf;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    uVar26 = local_b8.field_2._M_allocated_capacity;
  }
  if ((ulong)uVar26 < local_90 + local_b8._M_string_length) {
    uVar20 = 0xf;
    if (local_98 != local_88) {
      uVar20 = local_88[0];
    }
    if (uVar20 < local_90 + local_b8._M_string_length) goto LAB_0047cb2d;
    puVar15 = (undefined8 *)
              std::__cxx11::string::replace
                        ((ulong)&local_98,0,(char *)0x0,(ulong)local_b8._M_dataplus._M_p);
  }
  else {
LAB_0047cb2d:
    puVar15 = (undefined8 *)std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_98);
  }
  local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
  psVar21 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar21) {
    local_138.field_2._M_allocated_capacity = *psVar21;
    local_138.field_2._8_8_ = puVar15[3];
  }
  else {
    local_138.field_2._M_allocated_capacity = *psVar21;
    local_138._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_138._M_string_length = puVar15[1];
  *puVar15 = psVar21;
  puVar15[1] = 0;
  *(undefined1 *)psVar21 = 0;
  puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_138);
  psVar21 = puVar15 + 2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*puVar15 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar21) {
    local_118.field_2._M_allocated_capacity = *psVar21;
    local_118.field_2._8_8_ = puVar15[3];
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
  }
  else {
    local_118.field_2._M_allocated_capacity = *psVar21;
    local_118._M_dataplus._M_p = (pointer)*puVar15;
  }
  local_118._M_string_length = puVar15[1];
  *puVar15 = psVar21;
  puVar15[1] = 0;
  *(undefined1 *)(puVar15 + 2) = 0;
  helper::Throw<std::runtime_error>(&local_158,&local_f8,&local_d8,&local_118,-1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_118._M_dataplus._M_p != &local_118.field_2) {
    operator_delete(local_118._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_138._M_dataplus._M_p != &local_138.field_2) {
    operator_delete(local_138._M_dataplus._M_p);
  }
  if (local_98 != local_88) {
    operator_delete(local_98);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b8._M_dataplus._M_p != paVar2) {
    operator_delete(local_b8._M_dataplus._M_p);
  }
  if (local_70 != &local_60) {
    operator_delete(local_70);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
    operator_delete(local_d8._M_dataplus._M_p);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
    operator_delete(local_f8._M_dataplus._M_p);
  }
  if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
    operator_delete(local_158._M_dataplus._M_p);
  }
  pcVar17 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
            super__Vector_impl_data._M_start;
LAB_0047cccd:
  (bufferSTL->super_Buffer).m_Position = 0x28;
  cVar3 = pcVar17[0x28];
  (bufferSTL->super_Buffer).m_Position = 0x29;
  cVar24 = 'n';
  if (((this->super_Engine).m_IO)->m_ArrayOrder == ColumnMajor) {
    cVar24 = 'y';
  }
  if (cVar24 != cVar3) {
    pcVar25 = "row";
    if (cVar3 == 'y') {
      pcVar25 = "column";
    }
    local_158._M_dataplus._M_p = (pointer)((long)&local_158 + 0x10);
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_158,pcVar25,pcVar25 + (ulong)(cVar3 == 'y') * 3 + 3);
    local_f8._M_dataplus._M_p = (pointer)&local_f8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Engine","");
    local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_d8,"BP5Writer","");
    local_118._M_dataplus._M_p = (pointer)&local_118.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_118,"CountStepsInMetadataIndex","");
    std::operator+(&local_b8,
                   "ADIOS2 BP5 Engine only supports appending with the same column/row major settings as it was written. Existing file is "
                   ,&local_158);
    puVar15 = (undefined8 *)std::__cxx11::string::append((char *)&local_b8);
    psVar21 = puVar15 + 2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*puVar15 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar21) {
      local_138.field_2._M_allocated_capacity = *psVar21;
      local_138.field_2._8_8_ = puVar15[3];
      local_138._M_dataplus._M_p = (pointer)&local_138.field_2;
    }
    else {
      local_138.field_2._M_allocated_capacity = *psVar21;
      local_138._M_dataplus._M_p = (pointer)*puVar15;
    }
    local_138._M_string_length = puVar15[1];
    *puVar15 = psVar21;
    puVar15[1] = 0;
    *(undefined1 *)(puVar15 + 2) = 0;
    helper::Throw<std::runtime_error>(&local_f8,&local_d8,&local_118,&local_138,-1);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_138._M_dataplus._M_p != &local_138.field_2) {
      operator_delete(local_138._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_118._M_dataplus._M_p != &local_118.field_2) {
      operator_delete(local_118._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
      operator_delete(local_d8._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
      operator_delete(local_f8._M_dataplus._M_p);
    }
    if (local_158._M_dataplus._M_p != (pointer)((long)&local_158 + 0x10)) {
      operator_delete(local_158._M_dataplus._M_p);
    }
    pcVar17 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
              super__Vector_impl_data._M_start;
  }
  (bufferSTL->super_Buffer).m_Position = 0x40;
  uVar20 = (long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                 super__Vector_impl_data._M_finish - (long)pcVar17;
  if (uVar20 < 0x41) {
    uVar29 = 0;
    uVar31 = 0;
  }
  else {
    uVar22 = (ulong)this->m_AppendWriterCount;
    uVar27 = 0x40;
    uVar31 = 0;
    uVar29 = 0;
    do {
      cVar3 = pcVar17[uVar27];
      (bufferSTL->super_Buffer).m_Position = uVar27 + 9;
      if (cVar3 == 's') {
        (bufferSTL->super_Buffer).m_Position = uVar27 + 0x19;
        sVar28 = (*(long *)(pcVar17 + uVar27 + 0x19) << 4 | 8U) * (uVar22 & 0xffffffff) + uVar27 +
                 0x21;
        (bufferSTL->super_Buffer).m_Position = sVar28;
        uVar31 = uVar31 + 1;
      }
      else {
        sVar28 = uVar27 + 9;
        if (cVar3 == 'w') {
          uVar22 = *(ulong *)(pcVar17 + uVar27 + 9);
          (bufferSTL->super_Buffer).m_Position = uVar27 + 0x11;
          this->m_AppendWriterCount = (uint32_t)uVar22;
          uVar13 = *(uint *)(pcVar17 + uVar27 + 0x11);
          (bufferSTL->super_Buffer).m_Position = uVar27 + 0x19;
          this->m_AppendAggregatorCount = uVar13;
          uVar30 = *(ulong *)(pcVar17 + uVar27 + 0x19) & 0xffffffff;
          if (uVar29 < uVar30) {
            uVar29 = uVar30;
          }
          this->m_AppendSubfileCount = (uint)*(ulong *)(pcVar17 + uVar27 + 0x19);
          sVar28 = uVar27 + (uVar22 & 0xffffffff) * 8 + 0x21;
          (bufferSTL->super_Buffer).m_Position = sVar28;
        }
      }
      uVar27 = sVar28;
    } while (uVar27 < uVar20);
  }
  uVar13 = (this->super_BP5Engine).m_Parameters.AppendAfterSteps;
  if ((int)uVar13 < 0) {
    iVar14 = -1;
    if (-1 < (int)(uVar13 + uVar31)) {
      iVar14 = uVar13 + uVar31;
    }
    uVar13 = iVar14 + 1;
  }
  uVar23 = uVar31;
  if (uVar13 < uVar31) {
    uVar23 = uVar13;
  }
  local_78 = &this->m_AppendDataPos;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = local_158._M_string_length;
  local_158._0_16_ = auVar11 << 0x40;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
            (local_78,uVar29,(value_type_conflict9 *)&local_158);
  if (uVar23 == 0) {
    this->m_AppendMetadataPos = 0;
    this->m_AppendMetaMetadataPos = 0;
    this->m_AppendMetadataIndexPos = 0;
  }
  else {
    *(undefined4 *)&this->m_AppendMetadataPos = 0xffffffff;
    *(undefined4 *)((long)&this->m_AppendMetadataPos + 4) = 0xffffffff;
    *(undefined4 *)&this->m_AppendMetaMetadataPos = 0xffffffff;
    *(undefined4 *)((long)&this->m_AppendMetaMetadataPos + 4) = 0xffffffff;
    this->m_AppendMetadataIndexPos = 0xffffffffffffffff;
    puVar6 = (this->m_AppendDataPos).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_start;
    puVar7 = (this->m_AppendDataPos).
             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (puVar6 != puVar7) {
      memset(puVar6,0xff,((long)puVar7 + (-8 - (long)puVar6) & 0xfffffffffffffff8U) + 8);
    }
    if (uVar13 < uVar31) {
      (bufferSTL->super_Buffer).m_Position = 0x40;
      local_158._M_dataplus._M_p = (pointer)0x0;
      local_158._M_string_length = 0;
      local_158.field_2._M_allocated_capacity = 0;
      uVar31 = 0;
      do {
        uVar20 = (bufferSTL->super_Buffer).m_Position;
        pcVar17 = (bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                  super__Vector_impl_data._M_start;
        if ((ulong)((long)(bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>.
                          _M_impl.super__Vector_impl_data._M_finish - (long)pcVar17) <= uVar20)
        break;
        cVar3 = pcVar17[uVar20];
        (bufferSTL->super_Buffer).m_Position = uVar20 + 9;
        if (cVar3 == 's') {
          this->m_AppendMetadataIndexPos = uVar20;
          sVar28 = (bufferSTL->super_Buffer).m_Position;
          sVar8 = *(size_t *)(pcVar17 + sVar28);
          (bufferSTL->super_Buffer).m_Position = sVar28 + 0x10;
          lVar9 = *(long *)(pcVar17 + sVar28 + 0x10);
          (bufferSTL->super_Buffer).m_Position = sVar28 + 0x18;
          this->m_AppendMetadataPos = sVar8;
          uVar20 = (ulong)this->m_AppendWriterCount;
          if (uVar31 == uVar23) {
            if (uVar20 != 0) {
              puVar6 = (local_78->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                       ._M_impl.super__Vector_impl_data._M_start;
              uVar29 = 0;
              do {
                sVar28 = (bufferSTL->super_Buffer).m_Position;
                uVar22 = *(ulong *)(pcVar17 + sVar28);
                (bufferSTL->super_Buffer).m_Position = sVar28 + (lVar9 << 4 | 8U);
                if (uVar22 < puVar6[*(long *)(local_158._M_dataplus._M_p + uVar29 * 8)]) {
                  puVar6[*(long *)(local_158._M_dataplus._M_p + uVar29 * 8)] = uVar22;
                }
                uVar29 = uVar29 + 1;
              } while (uVar20 != uVar29);
            }
          }
          else {
            psVar1 = &(bufferSTL->super_Buffer).m_Position;
            *psVar1 = *psVar1 + (lVar9 << 4 | 8U) * uVar20;
          }
          uVar31 = uVar31 + 1;
        }
        else if (cVar3 == 'w') {
          uVar13 = *(uint *)(pcVar17 + uVar20 + 9);
          (bufferSTL->super_Buffer).m_Position = uVar20 + 0x11;
          this->m_AppendWriterCount = uVar13;
          uVar5 = *(uint *)(pcVar17 + uVar20 + 0x11);
          (bufferSTL->super_Buffer).m_Position = uVar20 + 0x19;
          this->m_AppendAggregatorCount = uVar5;
          uVar5 = *(uint *)(pcVar17 + uVar20 + 0x19);
          (bufferSTL->super_Buffer).m_Position = uVar20 + 0x21;
          this->m_AppendSubfileCount = uVar5;
          if ((pointer)local_158._M_string_length != local_158._M_dataplus._M_p) {
            local_158._M_string_length = (size_type)local_158._M_dataplus._M_p;
          }
          if (uVar13 != 0) {
            uVar20 = 0;
            do {
              sVar28 = (bufferSTL->super_Buffer).m_Position;
              local_f8._M_dataplus._M_p =
                   *(pointer *)
                    ((bufferSTL->m_Buffer).super__Vector_base<char,_std::allocator<char>_>._M_impl.
                     super__Vector_impl_data._M_start + sVar28);
              (bufferSTL->super_Buffer).m_Position = sVar28 + 8;
              if (local_158._M_string_length == local_158.field_2._M_allocated_capacity) {
                std::vector<unsigned_long,std::allocator<unsigned_long>>::
                _M_realloc_insert<unsigned_long_const&>
                          ((vector<unsigned_long,std::allocator<unsigned_long>> *)&local_158,
                           (iterator)local_158._M_string_length,(unsigned_long *)&local_f8);
                uVar13 = this->m_AppendWriterCount;
              }
              else {
                *(pointer *)local_158._M_string_length = local_f8._M_dataplus._M_p;
                local_158._M_string_length = (size_type)(local_158._M_string_length + 8);
              }
              uVar20 = uVar20 + 1;
            } while (uVar20 < uVar13);
          }
        }
      } while (uVar31 <= uVar23);
      if (local_158._M_dataplus._M_p != (pointer)0x0) {
        operator_delete(local_158._M_dataplus._M_p);
      }
    }
  }
  return (ulong)uVar23;
}

Assistant:

uint64_t BP5Writer::CountStepsInMetadataIndex(format::BufferSTL &bufferSTL)
{
    const auto &buffer = bufferSTL.m_Buffer;
    size_t &position = bufferSTL.m_Position;

    if (buffer.size() < m_IndexHeaderSize)
    {
        m_AppendMetadataPos = 0;
        m_AppendMetaMetadataPos = 0;
        m_AppendMetadataIndexPos = 0;
        m_AppendDataPos.resize(m_Aggregator->m_NumAggregators,
                               0ULL); // safe bet
        return 0;
    }

    // Check endinanness
    position = m_EndianFlagPosition;
    const uint8_t endianness = helper::ReadValue<uint8_t>(buffer, position);
    bool IsLittleEndian = (endianness == 0) ? true : false;
    if (helper::IsLittleEndian() != IsLittleEndian)
    {
        std::string m = (IsLittleEndian ? "Little" : "Big");

        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports appending with the same "
                                          "endianness. The existing file is " +
                                              m + "Endian");
    }

    // BP version
    position = m_BPVersionPosition;
    uint8_t Version = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    if (Version != 5)
    {
        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports bp format "
                                          "version 5, found " +
                                              std::to_string(Version) + " version");
    }

    // BP minor version
    position = m_BPMinorVersionPosition;
    uint8_t minorVersion = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    if (minorVersion != m_BP5MinorVersion)
    {
        helper::Throw<std::runtime_error>(
            "Engine", "BP5Writer", "CountStepsInMetadataIndex",
            "Current ADIOS2 BP5 Engine can only append to bp format 5." +
                std::to_string(m_BP5MinorVersion) + " but this file is 5." +
                std::to_string(minorVersion) + " version");
    }

    position = m_ColumnMajorFlagPosition;
    const uint8_t columnMajor = helper::ReadValue<uint8_t>(buffer, position, IsLittleEndian);
    const uint8_t NowColumnMajor = (m_IO.m_ArrayOrder == ArrayOrdering::ColumnMajor) ? 'y' : 'n';
    if (columnMajor != NowColumnMajor)
    {
        std::string m = (columnMajor == 'y' ? "column" : "row");
        helper::Throw<std::runtime_error>("Engine", "BP5Writer", "CountStepsInMetadataIndex",
                                          "ADIOS2 BP5 Engine only supports appending with the same "
                                          "column/row major settings as it was written."
                                          " Existing file is " +
                                              m + " major");
    }

    position = m_IndexHeaderSize; // after the header
    // Just count the steps first
    unsigned int availableSteps = 0;
    uint64_t nDataFiles = 0;
    while (position < buffer.size())
    {
        const unsigned char recordID =
            helper::ReadValue<unsigned char>(buffer, position, IsLittleEndian);
        position += sizeof(uint64_t); // recordLength

        switch (recordID)
        {
        case IndexRecord::WriterMapRecord: {
            m_AppendWriterCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendAggregatorCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendSubfileCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            if (m_AppendSubfileCount > nDataFiles)
            {
                nDataFiles = m_AppendSubfileCount;
            }
            // jump over writermap
            position += m_AppendWriterCount * sizeof(uint64_t);
            break;
        }
        case IndexRecord::StepRecord: {
            position += 2 * sizeof(uint64_t); // MetadataPos, MetadataSize
            const uint64_t FlushCount =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            // jump over the metadata positions
            position += sizeof(uint64_t) * m_AppendWriterCount * ((2 * FlushCount) + 1);
            availableSteps++;
            break;
        }
        }
    }

    unsigned int targetStep = 0;

    if (m_Parameters.AppendAfterSteps < 0)
    {
        // -1 means append after last step
        int s = (int)availableSteps + m_Parameters.AppendAfterSteps + 1;
        if (s < 0)
        {
            s = 0;
        }
        targetStep = static_cast<unsigned int>(s);
    }
    else
    {
        targetStep = static_cast<unsigned int>(m_Parameters.AppendAfterSteps);
    }
    if (targetStep > availableSteps)
    {
        targetStep = availableSteps;
    }

    m_AppendDataPos.resize(nDataFiles, 0ULL);

    if (!targetStep)
    {
        // append at 0 is like writing new file
        m_AppendMetadataPos = 0;
        m_AppendMetaMetadataPos = 0;
        m_AppendMetadataIndexPos = 0;
        return 0;
    }

    m_AppendMetadataPos = MaxSizeT; // size of header
    m_AppendMetaMetadataPos = MaxSizeT;
    m_AppendMetadataIndexPos = MaxSizeT;
    std::fill(m_AppendDataPos.begin(), m_AppendDataPos.end(), MaxSizeT);

    if (targetStep == availableSteps)
    {
        // append after existing steps
        return targetStep;
    }

    // append but not at 0 and not after existing steps
    // Read each record now completely to get offsets at step+1
    position = m_IndexHeaderSize;
    unsigned int currentStep = 0;
    std::vector<uint64_t> writerToFileMap;
    // reading one step beyond target to get correct offsets
    while (currentStep <= targetStep && position < buffer.size())
    {
        const unsigned char recordID =
            helper::ReadValue<unsigned char>(buffer, position, IsLittleEndian);
        position += sizeof(uint64_t); // recordLength

        switch (recordID)
        {
        case IndexRecord::WriterMapRecord: {
            m_AppendWriterCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendAggregatorCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            m_AppendSubfileCount =
                (uint32_t)helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);

            // Get the process -> subfile map
            writerToFileMap.clear();
            for (uint64_t i = 0; i < m_AppendWriterCount; i++)
            {
                const uint64_t subfileIdx =
                    helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
                writerToFileMap.push_back(subfileIdx);
            }
            break;
        }
        case IndexRecord::StepRecord: {
            m_AppendMetadataIndexPos =
                position - sizeof(unsigned char) - sizeof(uint64_t); // pos of RecordID
            const uint64_t MetadataPos =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);
            position += sizeof(uint64_t); // MetadataSize
            const uint64_t FlushCount =
                helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian);

            m_AppendMetadataPos = static_cast<size_t>(MetadataPos);

            if (currentStep == targetStep)
            {
                // we need the very first (smallest) write position to each
                // subfile Offsets and sizes,  2*FlushCount + 1 per writer
                for (uint64_t i = 0; i < m_AppendWriterCount; i++)
                {
                    // first flush/write position will do
                    const size_t FirstDataPos = static_cast<size_t>(
                        helper::ReadValue<uint64_t>(buffer, position, IsLittleEndian));
                    position += sizeof(uint64_t) * 2 * FlushCount; // no need to read
                    /* std::cout << "Writer " << i << " subfile " <<
                       writerToFileMap[i]  << "  first data loc:" <<
                       FirstDataPos << std::endl; */
                    if (FirstDataPos < m_AppendDataPos[writerToFileMap[i]])
                    {
                        m_AppendDataPos[writerToFileMap[i]] = FirstDataPos;
                    }
                }
            }
            else
            {
                // jump over all data offsets in this step
                position += sizeof(uint64_t) * m_AppendWriterCount * (1 + 2 * FlushCount);
            }
            currentStep++;
            break;
        }
        }
    }
    return targetStep;
}